

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_min,void *p_max,
                        char *format,ImGuiSliderFlags flags)

{
  float text_baseline_y;
  ImGuiWindow *this;
  ImDrawList *this_00;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  byte bVar4;
  ImGuiID id;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  byte bVar8;
  ImGuiCol idx;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  char *local_f8;
  ImRect frame_bb;
  ImRect grab_bb;
  ImVec2 local_90;
  ImRect total_bb;
  char value_buf [64];
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    fVar10 = CalcItemWidth();
    IVar1 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar11 = IVar1.x;
    text_baseline_y = (pIVar2->Style).FramePadding.y;
    frame_bb.Max.x = fVar10 + (this->DC).CursorPos.x;
    fVar10 = text_baseline_y + text_baseline_y + IVar1.y + (this->DC).CursorPos.y;
    frame_bb.Max.y = fVar10;
    frame_bb.Min = (this->DC).CursorPos;
    fVar12 = 0.0;
    if (0.0 < fVar11) {
      fVar12 = (pIVar2->Style).ItemInnerSpacing.x + fVar11;
    }
    total_bb.Max.y = fVar10 + 0.0;
    total_bb.Max.x = fVar12 + frame_bb.Max.x;
    uVar7 = flags & 0x80;
    total_bb.Min = frame_bb.Min;
    ItemSize(&total_bb,text_baseline_y);
    bVar3 = ItemAdd(&total_bb,id,&frame_bb,uVar7 * 2 ^ 0x100);
    if (bVar3) {
      if (format == (char *)0x0) {
        if (9 < (uint)data_type) {
          __assert_fail("data_type >= 0 && data_type < ImGuiDataType_COUNT",
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                        ,0x77f,"const ImGuiDataTypeInfo *ImGui::DataTypeGetInfo(ImGuiDataType)");
        }
        local_f8 = GDataTypeInfo[(uint)data_type].PrintFmt;
      }
      else {
        local_f8 = format;
        if ((data_type == 4) && (iVar5 = strcmp(format,"%d"), iVar5 != 0)) {
          local_f8 = PatchFormatStringFloatToInt(format);
        }
      }
      bVar3 = ItemHoverable(&frame_bb,id);
      if ((uVar7 == 0) && (GImGui->ActiveId == id)) {
        bVar9 = GImGui->TempInputId == id;
      }
      else {
        bVar9 = false;
      }
      if (!bVar9) {
        if (uVar7 == 0) {
          bVar4 = *(byte *)((long)&(pIVar2->LastItemData).StatusFlags + 1) & 1;
        }
        else {
          bVar4 = 0;
        }
        if (bVar3) {
          bVar8 = (pIVar2->IO).MouseClicked[0];
        }
        else {
          bVar8 = 0;
        }
        if (((bVar4 != 0 || (bVar8 & 1) != 0) || (pIVar2->NavActivateId == id)) ||
           (pIVar2->NavActivateInputId == id)) {
          SetActiveID(id,this);
          SetFocusID(id,this);
          FocusWindow(this);
          *(byte *)&pIVar2->ActiveIdUsingNavDirMask = (byte)pIVar2->ActiveIdUsingNavDirMask | 3;
          if ((uVar7 == 0) &&
             (((bVar4 != 0 || ((bVar8 != 0 && ((pIVar2->IO).KeyCtrl != false)))) ||
              (pIVar2->NavActivateInputId == id)))) goto LAB_0017adf5;
        }
        idx = 9;
        if (pIVar2->ActiveId != id) {
          idx = bVar3 + 7;
        }
        IVar6 = GetColorU32(idx,1.0);
        RenderNavHighlight(&frame_bb,id,1);
        RenderFrame(frame_bb.Min,frame_bb.Max,IVar6,true,(pIVar2->Style).FrameRounding);
        grab_bb.Min.x = 0.0;
        grab_bb.Min.y = 0.0;
        grab_bb.Max.x = 0.0;
        grab_bb.Max.y = 0.0;
        bVar3 = SliderBehavior(&frame_bb,id,data_type,p_data,p_min,p_max,local_f8,flags,&grab_bb);
        if (bVar3) {
          MarkItemEdited(id);
        }
        if (grab_bb.Min.x < grab_bb.Max.x) {
          this_00 = this->DrawList;
          IVar6 = GetColorU32((pIVar2->ActiveId == id) + 0x13,1.0);
          ImDrawList::AddRectFilled
                    (this_00,&grab_bb.Min,&grab_bb.Max,IVar6,(pIVar2->Style).GrabRounding,0);
        }
        iVar5 = DataTypeFormatString(value_buf,0x40,data_type,p_data,local_f8);
        if (pIVar2->LogEnabled == true) {
          LogSetNextTextDecoration("{","}");
        }
        local_90.x = 0.5;
        local_90.y = 0.5;
        RenderTextClipped(&frame_bb.Min,&frame_bb.Max,value_buf,value_buf + iVar5,(ImVec2 *)0x0,
                          &local_90,(ImRect *)0x0);
        if (fVar11 <= 0.0) {
          return bVar3;
        }
        IVar1.y = frame_bb.Min.y + (pIVar2->Style).FramePadding.y;
        IVar1.x = frame_bb.Max.x + (pIVar2->Style).ItemInnerSpacing.x;
        RenderText(IVar1,label,(char *)0x0,true);
        return bVar3;
      }
LAB_0017adf5:
      if ((flags & 0x10U) == 0) {
        p_max = (void *)0x0;
        p_min = (void *)0x0;
      }
      bVar3 = TempInputScalar(&frame_bb,id,label,data_type,p_data,local_f8,p_min,p_max);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}